

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

ArrayPtr<void_*const> __thiscall kj::getAsyncTrace(kj *this,ArrayPtr<void_*> space)

{
  undefined8 *puVar1;
  long in_FS_OFFSET;
  ArrayPtr<void_*const> AVar2;
  TraceBuilder builder;
  kj *local_20;
  kj *local_18;
  kj *local_10;
  
  if ((*(long *)(in_FS_OFFSET + -0x28) != 0) &&
     (puVar1 = *(undefined8 **)(*(long *)(in_FS_OFFSET + -0x28) + 0x70), puVar1 != (undefined8 *)0x0
     )) {
    local_10 = this + (long)space.ptr * 8;
    local_20 = this;
    local_18 = this;
    (**(code **)*puVar1)(puVar1,&local_20);
    AVar2.size_ = (long)local_18 - (long)local_20 >> 3;
    AVar2.ptr = (void **)local_20;
    return AVar2;
  }
  return (ArrayPtr<void_*const>)ZEXT816(0);
}

Assistant:

ArrayPtr<void* const> getAsyncTrace(ArrayPtr<void*> space) {
  EventLoop* loop = threadLocalEventLoop;
  if (loop == nullptr) return nullptr;
  if (loop->currentlyFiring == nullptr) return nullptr;

  _::TraceBuilder builder(space);
  loop->currentlyFiring->traceEvent(builder);
  return builder.finish();
}